

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_compareNonEquivalentUnitsWhichHaveDifferentBase_Test::
~Units_compareNonEquivalentUnitsWhichHaveDifferentBase_Test
          (Units_compareNonEquivalentUnitsWhichHaveDifferentBase_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, compareNonEquivalentUnitsWhichHaveDifferentBase)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::BECQUEREL, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::LUX, 0, 1.0, 1.0);

    EXPECT_FALSE(libcellml::Units::equivalent(u1, u2));
}